

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

Rule * Parser::getRule(Rule *__return_storage_ptr__,int id)

{
  pointer *ppNVar1;
  iterator __position;
  Node local_18;
  
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((__return_storage_ptr__->rights).
      super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  local_18 = (Node)((ulong)(uint)id << 0x20);
  __position._M_current =
       (__return_storage_ptr__->rights).
       super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->rights).
      super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Parser::Node,_std::allocator<Parser::Node>_>::_M_realloc_insert<Parser::Node>
              (&__return_storage_ptr__->rights,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    ppNVar1 = &(__return_storage_ptr__->rights).
               super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Rule getRule(int id){
        Rule res;
        res.rights.clear();
        res.rights.push_back(getNode(id));
        return res;
    }